

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
          (RepeatedPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  bool bVar1;
  mapped_type *pmVar2;
  allocator local_c9;
  key_type local_c8;
  allocator local_a1;
  key_type local_a0;
  allocator local_79;
  key_type local_78;
  allocator local_51;
  key_type local_50;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,options);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedPrimitiveFieldGenerator_006f57d8;
  this->descriptor_ = (FieldDescriptor *)options_local;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  anon_unknown_3::SetPrimitiveVariables((FieldDescriptor *)options_local,&this->variables_,local_20)
  ;
  bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)options_local);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"packed_reader",&local_51);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,"ReadPackedPrimitive");
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"repeated_reader",&local_79);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_78);
    std::__cxx11::string::operator=((string *)pmVar2,"ReadRepeatedPrimitiveNoInline");
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"packed_reader",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar2,"ReadPackedPrimitiveNoInline");
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"repeated_reader",&local_c9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar2,"ReadRepeatedPrimitive");
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : FieldGenerator(options), descriptor_(descriptor) {
  SetPrimitiveVariables(descriptor, &variables_, options);

  if (descriptor->is_packed()) {
    variables_["packed_reader"] = "ReadPackedPrimitive";
    variables_["repeated_reader"] = "ReadRepeatedPrimitiveNoInline";
  } else {
    variables_["packed_reader"] = "ReadPackedPrimitiveNoInline";
    variables_["repeated_reader"] = "ReadRepeatedPrimitive";
  }
}